

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O1

bool CompileSourceFile(NscCompiler *Compiler,int CompilerVersion,bool Optimize,bool IgnoreIncludes,
                      bool SuppressDebugSymbols,bool Quiet,bool VerifyCode,IDebugTextOut *TextOut,
                      UINT32 CompilerFlags,ResRef32 InFile,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *InFileContents,
                      string *OutBaseFile)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  NscResult NVar3;
  int iVar4;
  FILE *pFVar5;
  size_t sVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  Writer *pWVar9;
  int *piVar10;
  size_t ScriptTextLength;
  pointer ScriptText;
  bool bVar11;
  char *pcVar12;
  undefined7 in_register_00000089;
  string FileName;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Symbols;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Dependencies;
  Writer local_a8;
  
  Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &Dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  Dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FileName._M_dataplus._M_p = (pointer)&FileName.field_2;
  FileName._M_string_length = 0;
  FileName.field_2._M_local_buf[0] = '\0';
  Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)CONCAT71(in_register_00000089,Quiet) == 0) {
    (**TextOut->_vptr_IDebugTextOut)(TextOut,"Compiling: %s.nss",&InFile);
  }
  puVar2 = (InFileContents->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ScriptTextLength =
       (long)(InFileContents->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  ScriptText = (pointer)0x0;
  if (ScriptTextLength != 0) {
    ScriptText = puVar2;
  }
  NVar3 = NscCompiler::NscCompileScript
                    (Compiler,&InFile,ScriptText,ScriptTextLength,CompilerVersion,Optimize,
                     IgnoreIncludes,TextOut,CompilerFlags,&Code,&Symbols,&Dependencies);
  if (NVar3 == NscResult_Failure) {
    pcVar12 = "Compilation aborted with errors.\n";
  }
  else {
    if (NVar3 == NscResult_Success) {
      std::__cxx11::string::_M_assign((string *)&FileName);
      iVar4 = std::__cxx11::string::compare((char *)&FileName);
      if (iVar4 == 0) {
        bVar11 = true;
        (**TextOut->_vptr_IDebugTextOut)(TextOut,"Skipped compiled file generation.\n");
        goto LAB_001360c7;
      }
      std::__cxx11::string::append((char *)&FileName);
      pFVar5 = fopen(FileName._M_dataplus._M_p,"wb");
      if (pFVar5 == (FILE *)0x0) {
        local_a8._vptr_Writer = (_func_int **)&PTR__Writer_00193998;
        local_a8.m_msg = (LogMessage *)0x0;
        local_a8.m_level = Debug;
        local_a8.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/nwnsc/nwnsc.cpp";
        local_a8.m_line = 0x3ec;
        local_a8.m_func =
             "bool CompileSourceFile(NscCompiler &, int, bool, bool, bool, bool, bool, IDebugTextOut *, UINT32, const NWN::ResRef32, const std::vector<unsigned char> &, const std::string &)"
        ;
        local_a8.m_verboseLevel = 0;
        local_a8.m_logger = (Logger *)0x0;
        local_a8.m_proceed = false;
        local_a8.m_messageBuilder.m_logger = (Logger *)0x0;
        local_a8.m_messageBuilder.m_containerLogSeperator = "";
        local_a8.m_dispatchAction = NormalLog;
        local_a8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar9 = el::base::Writer::construct(&local_a8,1,"default");
        if (pWVar9->m_proceed == true) {
          el::base::MessageBuilder::operator<<(&pWVar9->m_messageBuilder,"Error Number ");
        }
        if (pWVar9->m_proceed == true) {
          piVar10 = __errno_location();
          el::base::MessageBuilder::operator<<(&pWVar9->m_messageBuilder,*piVar10);
        }
        el::base::Writer::~Writer(&local_a8);
        pcVar12 = "Error: Unable to open output file %s.\n";
      }
      else if ((Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) ||
              (sVar6 = fwrite(Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)Code.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)Code.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,1,pFVar5), sVar6 == 1)
              ) {
        fclose(pFVar5);
        if (SuppressDebugSymbols) {
LAB_00135fbf:
          bVar11 = true;
          if ((CompilerFlags & 0x10) == 0) goto LAB_001360c7;
          std::__cxx11::string::_M_assign((string *)&FileName);
          std::__cxx11::string::append((char *)&FileName);
          pFVar5 = fopen(FileName._M_dataplus._M_p,"w");
          if (pFVar5 != (FILE *)0x0) {
            p_Var1 = &Dependencies._M_t._M_impl.super__Rb_tree_header;
            if (Dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              fprintf(pFVar5,"%s.ncs: %s.nss ",(OutBaseFile->_M_dataplus)._M_p);
              for (p_Var7 = Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  p_Var8 = Dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                  (_Rb_tree_header *)p_Var7 != p_Var1;
                  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
                fprintf(pFVar5," \\\n    %s",*(undefined8 *)(p_Var7 + 1));
              }
              for (; (_Rb_tree_header *)p_Var8 != p_Var1;
                  p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
                fprintf(pFVar5,"\n%s:\n",*(undefined8 *)(p_Var8 + 1));
              }
            }
            fclose(pFVar5);
            goto LAB_001360c7;
          }
          pcVar12 = "Error: Failed to open dependency file %s.\n";
        }
        else {
          std::__cxx11::string::_M_assign((string *)&FileName);
          std::__cxx11::string::append((char *)&FileName);
          pFVar5 = fopen(FileName._M_dataplus._M_p,"wb");
          if (pFVar5 == (FILE *)0x0) {
            pcVar12 = "Error: Failed to open debug symbols file %s.\n";
          }
          else {
            if ((Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (sVar6 = fwrite(Symbols.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)Symbols.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)Symbols.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1,pFVar5), sVar6 == 1
               )) {
              fclose(pFVar5);
              goto LAB_00135fbf;
            }
            fclose(pFVar5);
            pcVar12 = "Error: Failed to write to debug symbols file %s.\n";
          }
        }
      }
      else {
        fclose(pFVar5);
        pcVar12 = "Error: Failed to write to output file %s.\n";
      }
      bVar11 = false;
      (**TextOut->_vptr_IDebugTextOut)(TextOut,pcVar12,FileName._M_dataplus._M_p);
      goto LAB_001360c7;
    }
    if (NVar3 == NscResult_Include) {
      bVar11 = true;
      if (IgnoreIncludes && !Quiet) {
        (**TextOut->_vptr_IDebugTextOut)(TextOut,"%s.nss is an include file, ignored.");
      }
      goto LAB_001360c7;
    }
    pcVar12 = "Unknown compiler status code.\n";
  }
  bVar11 = false;
  (**TextOut->_vptr_IDebugTextOut)(TextOut,pcVar12,&InFile);
LAB_001360c7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FileName._M_dataplus._M_p != &FileName.field_2) {
    operator_delete(FileName._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&Dependencies._M_t);
  if (Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(Symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(Code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar11;
}

Assistant:

bool
CompileSourceFile(
        NscCompiler &Compiler,
        int CompilerVersion,
        bool Optimize,
        bool IgnoreIncludes,
        bool SuppressDebugSymbols,
        bool Quiet,
        bool VerifyCode,
        IDebugTextOut *TextOut,
        UINT32 CompilerFlags,
        const NWN::ResRef32 InFile,
        const std::vector<unsigned char> &InFileContents,
        const std::string &OutBaseFile
)
/*++

Routine Description:

	This routine compiles a single source file according to the specified set of
	compilation options.

Arguments:

	NscCompiler - Supplies the compiler context that will be used to process the
	              request.

	CompilerVersion - Supplies the BioWare-compatible compiler version number.

	Optimize - Supplies a Boolean value indicating true if the script should be
	           optimized.

	IgnoreIncludes - Supplies a Boolean value indicating true if include-only
	                 source files should be ignored.

	SuppressDebugSymbols - Supplies a Boolean value indicating true if debug
	                       symbol generation should be suppressed.

	Quiet - Supplies a Boolean value that indicates true if non-critical
	        messages should be silenced.

	VerifyCode - Supplies a Boolean value that indicates true if generated code
	             is to be verified with the analyzer/verifier if compilation was
	             successful.

	TextOut - Supplies the text out interface used to receive any diagnostics
	          issued.

	CompilerFlags - Supplies compiler control flags.  Legal values are drawn
	                from the NscCompilerFlags enumeration.

	InFile - Supplies the RESREF corresponding to the input file name.

	InFileContents - Supplies the contents of the input file.

	OutBaseFile - Supplies the base name (potentially including path) of the
	              output file.  No extension is present.

Return Value:

	The routine returns a Boolean value indicating true on success, else false
	on failure.

	On catastrophic failure, an std::exception is raised.

Environment:

	User mode.

--*/
{
    std::vector<unsigned char> Code;
    std::vector<unsigned char> Symbols;
    std::set<std::string> Dependencies;
    NscResult Result;
    std::string FileName;
    FILE *f;

    char filec[_MAX_FNAME];

    strncpy(filec, InFile.RefStr, _MAX_FNAME);

    if (!Quiet) {
        TextOut->WriteText("Compiling: %s.nss", InFile.RefStr);
    }

    //
    // Execute the main compilation pass.
    //

    Result = Compiler.NscCompileScript(
            InFile,
            (!InFileContents.empty()) ? &InFileContents[0] : nullptr,
            InFileContents.size(),
            CompilerVersion,
            Optimize,
            IgnoreIncludes,
            TextOut,
            CompilerFlags,
            Code,
            Symbols,
            Dependencies);

    switch (Result) {

        case NscResult_Failure:
            TextOut->WriteText(
                    "Compilation aborted with errors.\n");

            return false;

        case NscResult_Include:
            if (!Quiet && IgnoreIncludes) {
                TextOut->WriteText(
                        "%s.nss is an include file, ignored.",
                        InFile.RefStr);
            }

            return true;

        case NscResult_Success:
            break;

        default:
            TextOut->WriteText(
                    "Unknown compiler status code.\n");

            return false;

    }

    //
    // If we compiled successfully, write the results to disk.
    //

    FileName = OutBaseFile;

    if (FileName == "SKIP_OUTPUT") {
        TextOut->WriteText(
                "Skipped compiled file generation.\n");
        return true;
    }

    FileName += ".ncs";
    f = fopen(FileName.c_str(), "wb");

    if (f == nullptr) {
        LOG(DEBUG) << "Error Number " << errno;
        TextOut->WriteText(
                "Error: Unable to open output file %s.\n",
                FileName.c_str());

        return false;
    }

    if (!Code.empty()) {
        if (fwrite(&Code[0], Code.size(), 1, f) != 1) {
            fclose(f);

            TextOut->WriteText(
                    "Error: Failed to write to output file %s.\n",
                    FileName.c_str());

            return false;
        }
    }

    fclose(f);

    if (!SuppressDebugSymbols) {
        FileName = OutBaseFile;
        FileName += ".ndb";

        f = fopen(FileName.c_str(), "wb");

        if (f == nullptr) {
            TextOut->WriteText(
                    "Error: Failed to open debug symbols file %s.\n",
                    FileName.c_str());

            return false;
        }

        if (!Symbols.empty()) {
            if (fwrite(&Symbols[0], Symbols.size(), 1, f) != 1) {
                fclose(f);

                TextOut->WriteText(
                        "Error: Failed to write to debug symbols file %s.\n",
                        FileName.c_str());

                return false;
            }
        }

        fclose(f);
    }

    if (CompilerFlags & NscCompilerFlag_GenerateMakeDeps) {
        FileName = OutBaseFile;
        FileName += ".d";

        f = fopen(FileName.c_str(), "w");

        if (f == nullptr) {
            TextOut->WriteText(
                    "Error: Failed to open dependency file %s.\n",
                    FileName.c_str());

            return false;
        }

        if (!Dependencies.empty()) {
            // NCS primarily depends on the NSS
            fprintf(f, "%s.ncs: %s.nss ", OutBaseFile.c_str(), OutBaseFile.c_str());

            // Print all other dependencies
            for (auto& dep : Dependencies)
                fprintf(f, " \\\n    %s", dep.c_str());

            // Create phony rules for dependencies, so deleting them doesn't
            // require deleting all .d files as well.
            for (auto& dep : Dependencies)
                fprintf(f, "\n%s:\n", dep.c_str());
        }

        fclose(f);
    }
    return true;
}